

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
Generator_odeUnknownVarOnRhs_Test::~Generator_odeUnknownVarOnRhs_Test
          (Generator_odeUnknownVarOnRhs_Test *this)

{
  Generator_odeUnknownVarOnRhs_Test *this_local;
  
  ~Generator_odeUnknownVarOnRhs_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Generator, odeUnknownVarOnRhs)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/ode_unknown_var_on_rhs/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    EXPECT_EQ(fileContents("generator/ode_unknown_var_on_rhs/model.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/ode_unknown_var_on_rhs/model.c"), generator->implementationCode());

    auto profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/ode_unknown_var_on_rhs/model.py"), generator->implementationCode());
}